

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprNodeTest_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  int iVar1;
  Fts5ExprNode *p2;
  int iVar2;
  long lVar3;
  Fts5ExprNode *p1;
  
  p1 = pNode->apChild[0];
  iVar1 = pNode->nChild;
  for (lVar3 = 7; lVar3 + -6 < (long)iVar1; lVar3 = lVar3 + 1) {
    p2 = pNode->apChild[lVar3 + -6];
    iVar2 = fts5NodeCompare(pExpr,p1,p2);
    if ((0 < iVar2) || ((iVar2 == 0 && (p2->bNomatch == 0)))) {
      p1 = p2;
    }
  }
  pNode->iRowid = p1->iRowid;
  iVar1 = p1->bNomatch;
  pNode->bEof = p1->bEof;
  pNode->bNomatch = iVar1;
  return;
}

Assistant:

static void fts5ExprNodeTest_OR(
  Fts5Expr *pExpr,                /* Expression of which pNode is a part */
  Fts5ExprNode *pNode             /* Expression node to test */
){
  Fts5ExprNode *pNext = pNode->apChild[0];
  int i;

  for(i=1; i<pNode->nChild; i++){
    Fts5ExprNode *pChild = pNode->apChild[i];
    int cmp = fts5NodeCompare(pExpr, pNext, pChild);
    if( cmp>0 || (cmp==0 && pChild->bNomatch==0) ){
      pNext = pChild;
    }
  }
  pNode->iRowid = pNext->iRowid;
  pNode->bEof = pNext->bEof;
  pNode->bNomatch = pNext->bNomatch;
}